

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::TimerHeap(TimerHeap *this,EventLoop *loop)

{
  EventLoop *this_00;
  int iVar1;
  Channel *this_01;
  element_type *peVar2;
  code *local_e0;
  undefined8 local_d8;
  type local_d0;
  Functor local_a8;
  TimerHeap *local_88;
  code *local_80;
  undefined8 local_78;
  type local_70;
  EventCallback local_58;
  undefined1 local_28 [8];
  ChannelPtr channel;
  EventLoop *loop_local;
  TimerHeap *this_local;
  
  channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)loop;
  noncopyable::noncopyable((noncopyable *)this);
  iVar1 = timerfd_create(1,0x80800);
  this->timerfd_ = iVar1;
  this->loop_ = (EventLoop *)
                channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::
  unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
  ::unordered_map(&this->timerMap_);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::vector
            (&this->timerHeap_);
  if (this->timerfd_ != -1) {
    bzero(&this->howlong_,0x20);
    this_01 = (Channel *)operator_new(0xa8);
    Channel::Channel(this_01,this->loop_,this->timerfd_);
    std::shared_ptr<Channel>::shared_ptr<Channel,void>((shared_ptr<Channel> *)local_28,this_01);
    peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    Channel::setEvent(peVar2,-0x7fffffff);
    peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    local_80 = handleTimeout;
    local_78 = 0;
    local_88 = this;
    std::bind<void(TimerHeap::*)(),TimerHeap*>
              (&local_70,(offset_in_TimerHeap_to_subr *)&local_80,&local_88);
    std::function<void()>::function<std::_Bind<void(TimerHeap::*(TimerHeap*))()>,void>
              ((function<void()> *)&local_58,&local_70);
    Channel::setReadCallback(peVar2,&local_58);
    std::function<void_()>::~function(&local_58);
    this_00 = this->loop_;
    local_e0 = EventLoop::addChannel;
    local_d8 = 0;
    std::bind<void(EventLoop::*)(std::shared_ptr<Channel>),EventLoop*&,std::shared_ptr<Channel>&>
              (&local_d0,(offset_in_EventLoop_to_subr *)&local_e0,&this->loop_,
               (shared_ptr<Channel> *)local_28);
    std::function<void()>::
    function<std::_Bind<void(EventLoop::*(EventLoop*,std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>,void>
              ((function<void()> *)&local_a8,&local_d0);
    EventLoop::runInLoop(this_00,&local_a8);
    std::function<void_()>::~function(&local_a8);
    std::_Bind<void_(EventLoop::*(EventLoop_*,_std::shared_ptr<Channel>))(std::shared_ptr<Channel>)>
    ::~_Bind(&local_d0);
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)local_28);
    return;
  }
  __assert_fail("timerfd_ != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                ,0x14,"TimerHeap::TimerHeap(EventLoop *)");
}

Assistant:

TimerHeap::TimerHeap(EventLoop* loop) 
    : timerfd_(timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK | TFD_CLOEXEC)),
      loop_(loop) {
    assert(timerfd_ != -1);
    bzero(&howlong_, sizeof howlong_);
    ChannelPtr channel(new Channel(loop_, timerfd_));
    channel->setEvent(EPOLLIN | EPOLLET);
    channel->setReadCallback(std::bind(&TimerHeap::handleTimeout, this));
    loop_->runInLoop(std::bind(&EventLoop::addChannel, loop_, channel));
}